

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc2b.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream *this;
  MelCepstrumToMlsaDigitalFilterCoefficients *this_00;
  char *pcVar5;
  size_type __n;
  bool bVar6;
  allocator local_42d;
  int num_order;
  double alpha;
  MelCepstrumToMlsaDigitalFilterCoefficients local_420;
  MelCepstrumToMlsaDigitalFilterCoefficients mel_cepstrum_to_mlsa_digital_filter_coefficients;
  vector<double,_std::allocator<double>_> mel_cepstrum;
  vector<double,_std::allocator<double>_> mlsa_digital_filter_coefficients;
  ostringstream error_message_4;
  ifstream ifs;
  byte abStack_218 [488];
  
  num_order = 0x19;
  alpha = 0.35;
LAB_001025e5:
  while (iVar3 = ya_getopt_long(argc,argv,"m:a:h",(option *)0x0,(int *)0x0), iVar3 != 0x61) {
    if (iVar3 != 0x6d) {
      if (iVar3 != -1) {
        if (iVar3 != 0x68) {
          anon_unknown.dwarf_2b03::PrintUsage((ostream *)&std::cerr);
          return 1;
        }
        anon_unknown.dwarf_2b03::PrintUsage((ostream *)&std::cout);
        return 0;
      }
      if (1 < argc - ya_optind) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
        std::operator<<((ostream *)&ifs,"Too many input files");
        std::__cxx11::string::string
                  ((string *)&error_message_4,"mc2b",
                   (allocator *)&mel_cepstrum_to_mlsa_digital_filter_coefficients);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
        goto LAB_001028e9;
      }
      if (argc == ya_optind) {
        pcVar5 = (char *)0x0;
      }
      else {
        pcVar5 = argv[ya_optind];
      }
      bVar1 = sptk::SetBinaryMode();
      this = (ostringstream *)&ifs;
      if (!bVar1) {
        std::__cxx11::ostringstream::ostringstream(this);
        std::operator<<((ostream *)this,"Cannot set translation mode");
        std::__cxx11::string::string
                  ((string *)&error_message_4,"mc2b",
                   (allocator *)&mel_cepstrum_to_mlsa_digital_filter_coefficients);
        sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
        goto LAB_001028e9;
      }
      std::ifstream::ifstream(this);
      if ((pcVar5 == (char *)0x0) ||
         (std::ifstream::open((char *)&ifs,(_Ios_Openmode)pcVar5),
         (abStack_218[*(long *)(_ifs + -0x18)] & 5) == 0)) {
        cVar2 = std::__basic_file<char>::is_open();
        if (cVar2 == '\0') {
          this = (ostringstream *)&std::cin;
        }
        sptk::MelCepstrumToMlsaDigitalFilterCoefficients::MelCepstrumToMlsaDigitalFilterCoefficients
                  (&mel_cepstrum_to_mlsa_digital_filter_coefficients,num_order,alpha);
        if (mel_cepstrum_to_mlsa_digital_filter_coefficients.is_valid_ != false) {
          __n = (long)num_order + 1;
          std::vector<double,_std::allocator<double>_>::vector
                    (&mel_cepstrum,__n,(allocator_type *)&error_message_4);
          std::vector<double,_std::allocator<double>_>::vector
                    (&mlsa_digital_filter_coefficients,__n,(allocator_type *)&error_message_4);
          goto LAB_00102999;
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
        std::operator<<((ostream *)&error_message_4,
                        "Failed to initialize MelCepstrumToMlsaDigitalFilterCoefficients");
        std::__cxx11::string::string((string *)&local_420,"mc2b",(allocator *)&mel_cepstrum);
        sptk::PrintErrorMessage((string *)&local_420,&error_message_4);
        this_00 = &local_420;
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
        poVar4 = std::operator<<((ostream *)&error_message_4,"Cannot open file ");
        std::operator<<(poVar4,pcVar5);
        std::__cxx11::string::string
                  ((string *)&mel_cepstrum_to_mlsa_digital_filter_coefficients,"mc2b",
                   (allocator *)&local_420);
        sptk::PrintErrorMessage
                  ((string *)&mel_cepstrum_to_mlsa_digital_filter_coefficients,&error_message_4);
        this_00 = &mel_cepstrum_to_mlsa_digital_filter_coefficients;
      }
      std::__cxx11::string::~string((string *)this_00);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
      iVar3 = 1;
      goto LAB_00102b15;
    }
    std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_4);
    bVar1 = sptk::ConvertStringToInteger((string *)&ifs,&num_order);
    bVar6 = num_order < 0;
    std::__cxx11::string::~string((string *)&ifs);
    if (bVar6 || !bVar1) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
      poVar4 = std::operator<<((ostream *)&ifs,"The argument for the -m option must be a ");
      std::operator<<(poVar4,"non-negative integer");
      std::__cxx11::string::string
                ((string *)&error_message_4,"mc2b",
                 (allocator *)&mel_cepstrum_to_mlsa_digital_filter_coefficients);
      sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
LAB_001028e9:
      std::__cxx11::string::~string((string *)&error_message_4);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&ifs);
      return 1;
    }
  }
  std::__cxx11::string::string((string *)&ifs,ya_optarg,(allocator *)&error_message_4);
  bVar1 = sptk::ConvertStringToDouble((string *)&ifs,&alpha);
  if (bVar1) {
    bVar1 = sptk::IsValidAlpha(alpha);
    std::__cxx11::string::~string((string *)&ifs);
    if (bVar1) goto LAB_001025e5;
  }
  else {
    std::__cxx11::string::~string((string *)&ifs);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&ifs);
  std::operator<<((ostream *)&ifs,"The argument for the -a option must be in (-1.0, 1.0)");
  std::__cxx11::string::string
            ((string *)&error_message_4,"mc2b",
             (allocator *)&mel_cepstrum_to_mlsa_digital_filter_coefficients);
  sptk::PrintErrorMessage((string *)&error_message_4,(ostringstream *)&ifs);
  goto LAB_001028e9;
LAB_00102999:
  bVar1 = sptk::ReadStream<double>(false,0,0,(int)__n,&mel_cepstrum,(istream *)this,(int *)0x0);
  if (!bVar1) {
    iVar3 = 0;
    goto LAB_00102b01;
  }
  bVar1 = sptk::MelCepstrumToMlsaDigitalFilterCoefficients::Run
                    (&mel_cepstrum_to_mlsa_digital_filter_coefficients,&mel_cepstrum,
                     &mlsa_digital_filter_coefficients);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
    std::operator<<((ostream *)&error_message_4,
                    "Failed to convert mel-cepstrum to MLSA digital filter coefficients");
    std::__cxx11::string::string((string *)&local_420,"mc2b",&local_42d);
    sptk::PrintErrorMessage((string *)&local_420,&error_message_4);
    goto LAB_00102ae7;
  }
  bVar1 = sptk::WriteStream<double>
                    (0,(int)__n,&mlsa_digital_filter_coefficients,(ostream *)&std::cout,(int *)0x0);
  if (!bVar1) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&error_message_4);
    std::operator<<((ostream *)&error_message_4,"Failed to write MLSA digital filter coefficients");
    std::__cxx11::string::string((string *)&local_420,"mc2b",&local_42d);
    sptk::PrintErrorMessage((string *)&local_420,&error_message_4);
LAB_00102ae7:
    std::__cxx11::string::~string((string *)&local_420);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&error_message_4);
    iVar3 = 1;
LAB_00102b01:
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&mlsa_digital_filter_coefficients.super__Vector_base<double,_std::allocator<double>_>
              );
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
              (&mel_cepstrum.super__Vector_base<double,_std::allocator<double>_>);
LAB_00102b15:
    std::ifstream::~ifstream(&ifs);
    return iVar3;
  }
  goto LAB_00102999;
}

Assistant:

int main(int argc, char* argv[]) {
  int num_order(kDefaultNumOrder);
  double alpha(kDefaultAlpha);

  for (;;) {
    const int option_char(getopt_long(argc, argv, "m:a:h", NULL, NULL));
    if (-1 == option_char) break;

    switch (option_char) {
      case 'm': {
        if (!sptk::ConvertStringToInteger(optarg, &num_order) ||
            num_order < 0) {
          std::ostringstream error_message;
          error_message << "The argument for the -m option must be a "
                        << "non-negative integer";
          sptk::PrintErrorMessage("mc2b", error_message);
          return 1;
        }
        break;
      }
      case 'a': {
        if (!sptk::ConvertStringToDouble(optarg, &alpha) ||
            !sptk::IsValidAlpha(alpha)) {
          std::ostringstream error_message;
          error_message
              << "The argument for the -a option must be in (-1.0, 1.0)";
          sptk::PrintErrorMessage("mc2b", error_message);
          return 1;
        }
        break;
      }
      case 'h': {
        PrintUsage(&std::cout);
        return 0;
      }
      default: {
        PrintUsage(&std::cerr);
        return 1;
      }
    }
  }

  const int num_input_files(argc - optind);
  if (1 < num_input_files) {
    std::ostringstream error_message;
    error_message << "Too many input files";
    sptk::PrintErrorMessage("mc2b", error_message);
    return 1;
  }
  const char* input_file(0 == num_input_files ? NULL : argv[optind]);

  if (!sptk::SetBinaryMode()) {
    std::ostringstream error_message;
    error_message << "Cannot set translation mode";
    sptk::PrintErrorMessage("mc2b", error_message);
    return 1;
  }

  std::ifstream ifs;
  if (NULL != input_file) {
    ifs.open(input_file, std::ios::in | std::ios::binary);
    if (ifs.fail()) {
      std::ostringstream error_message;
      error_message << "Cannot open file " << input_file;
      sptk::PrintErrorMessage("mc2b", error_message);
      return 1;
    }
  }
  std::istream& input_stream(ifs.is_open() ? ifs : std::cin);

  sptk::MelCepstrumToMlsaDigitalFilterCoefficients
      mel_cepstrum_to_mlsa_digital_filter_coefficients(num_order, alpha);
  if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.IsValid()) {
    std::ostringstream error_message;
    error_message
        << "Failed to initialize MelCepstrumToMlsaDigitalFilterCoefficients";
    sptk::PrintErrorMessage("mc2b", error_message);
    return 1;
  }

  const int length(num_order + 1);
  std::vector<double> mel_cepstrum(length);
  std::vector<double> mlsa_digital_filter_coefficients(length);

  while (sptk::ReadStream(false, 0, 0, length, &mel_cepstrum, &input_stream,
                          NULL)) {
    if (!mel_cepstrum_to_mlsa_digital_filter_coefficients.Run(
            mel_cepstrum, &mlsa_digital_filter_coefficients)) {
      std::ostringstream error_message;
      error_message << "Failed to convert mel-cepstrum to MLSA digital "
                       "filter coefficients";
      sptk::PrintErrorMessage("mc2b", error_message);
      return 1;
    }

    if (!sptk::WriteStream(0, length, mlsa_digital_filter_coefficients,
                           &std::cout, NULL)) {
      std::ostringstream error_message;
      error_message << "Failed to write MLSA digital filter coefficients";
      sptk::PrintErrorMessage("mc2b", error_message);
      return 1;
    }
  }

  return 0;
}